

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeFunctionConstructor
               (DynamicObject *functionConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  ScriptContext *this;
  JavascriptLibrary *this_00;
  DynamicObject **ppDVar1;
  Var value;
  PropertyString *value_00;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *functionConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,functionConstructor,mode,3,0);
  this = RecyclableObject::GetScriptContext(&functionConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&functionConstructor->super_RecyclableObject);
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).functionPrototype)
  ;
  AddMember(this_00,functionConstructor,0x124,*ppDVar1,'\0');
  value = TaggedInt::ToVarUnchecked(1);
  AddMember(this_00,functionConstructor,0xd1,value,'\x02');
  value_00 = ScriptContext::GetPropertyString(this,0x9b);
  AddMember(this_00,functionConstructor,0x106,value_00,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(functionConstructor,true);
  if ((DAT_01ea4153 & 1) != 0) {
    AddFunctionToLibraryObject
              (this_00,functionConstructor,0xbc,
               (FunctionInfo *)JavascriptFunction::EntryInfo::InvokeJit,1,'\x06');
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeFunctionConstructor(DynamicObject* functionConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(functionConstructor, mode, 3);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterFunction
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = functionConstructor->GetScriptContext();
        JavascriptLibrary* library = functionConstructor->GetLibrary();
        library->AddMember(functionConstructor, PropertyIds::prototype, library->functionPrototype, PropertyNone);
        library->AddMember(functionConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(functionConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Function), PropertyConfigurable);

        functionConstructor->SetHasNoEnumerableProperties(true);

#ifdef ALLOW_JIT_REPRO
        if (CONFIG_FLAG(JitRepro))
        {
            library->AddFunctionToLibraryObject(functionConstructor, PropertyIds::invokeJit, &JavascriptFunction::EntryInfo::InvokeJit, 1);
        }
#endif

        return true;
    }